

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O1

ll128 * __thiscall
reed_solomn::lc(ll128 *__return_storage_ptr__,reed_solomn *this,
               vector<__int128,_std::allocator<__int128>_> *A)

{
  ulong uVar1;
  long *plVar2;
  ulong uVar3;
  vector<__int128,_std::allocator<__int128>_> local_30;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector
            (&local_30,(vector<__int128,_std::allocator<__int128>_> *)this);
  uVar1 = (ulong)((long)local_30.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_30.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 4;
  do {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) {
      uVar3 = 0;
      break;
    }
    uVar3 = (ulong)((uint)uVar1 & 0x7fffffff);
  } while ((long)local_30.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3] == 0 &&
           *(long *)((long)local_30.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar3 * 0x10 + 8) == 0);
  if (local_30.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"deg: ",5);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return (ll128 *)this->_vptr_reed_solomn[uVar3 * 2];
}

Assistant:

ll128 reed_solomn::lc(vector<ll128> A) {
    int deg = degree(A);
    cout << "deg: " << deg << endl;
    return A[deg];
}